

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O3

bool __thiscall
Rml::DecoratorTiledVertical::Initialise
          (DecoratorTiledVertical *this,Tile *_tiles,Texture *_textures)

{
  int iVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  long lVar5;
  TextureFileIndex *pTVar6;
  byte bVar7;
  Texture texture;
  
  bVar7 = 0;
  pTVar6 = &_textures->file_index;
  lVar5 = 0x30;
  do {
    puVar3 = (undefined4 *)((long)(&_tiles->tile_data + -3) + lVar5);
    puVar4 = (undefined4 *)
             ((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5);
    for (lVar2 = 0x13; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    texture._8_8_ = *(undefined8 *)pTVar6;
    texture.render_manager = ((Texture *)(pTVar6 + -2))->render_manager;
    iVar1 = Decorator::AddTexture((Decorator *)this,texture);
    *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) = iVar1;
    pTVar6 = pTVar6 + 4;
    lVar5 = lVar5 + 0x4c;
  } while (lVar5 != 0x114);
  iVar1 = *(int *)&this->field_0x7c;
  if (*(int *)&this->field_0x30 == -1) {
    if (iVar1 < 0) {
      if (iVar1 == -1) {
        return false;
      }
      goto LAB_0021411f;
    }
    puVar3 = (undefined4 *)&this->field_0x7c;
    puVar4 = (undefined4 *)&this->field_0x30;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    lVar5 = 100;
  }
  else {
    if (*(int *)&this->field_0x30 < 0 || iVar1 != -1) goto LAB_0021411f;
    puVar3 = (undefined4 *)&this->field_0x30;
    puVar4 = (undefined4 *)&this->field_0x7c;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
    }
    lVar5 = 0xb0;
  }
  *(undefined4 *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar5) = 1;
LAB_0021411f:
  return *(int *)&this->field_0xc8 != -1;
}

Assistant:

bool DecoratorTiledVertical::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 3; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// If only one side of the decorator has been configured, then mirror the texture for the other side.
	if (tiles[TOP].texture_index == -1 && tiles[BOTTOM].texture_index > -1)
	{
		tiles[TOP] = tiles[BOTTOM];
		tiles[TOP].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[BOTTOM].texture_index == -1 && tiles[TOP].texture_index > -1)
	{
		tiles[BOTTOM] = tiles[TOP];
		tiles[BOTTOM].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[TOP].texture_index == -1 && tiles[BOTTOM].texture_index == -1)
		return false;

	if (tiles[CENTRE].texture_index == -1)
		return false;

	return true;
}